

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextUpdateDocking(ImGuiContext *ctx)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiDockRequest *pIVar4;
  ImGuiDockNode *pIVar5;
  ImGuiDockRequest *__dest;
  uint uVar6;
  ImGuiContext *g;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    return;
  }
  ctx->HoveredDockNode = (ImGuiDockNode *)0x0;
  pIVar3 = ctx->HoveredWindowUnderMovingWindow;
  if (pIVar3 != (ImGuiWindow *)0x0) {
    if (pIVar3->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      pIVar5 = pIVar3->RootWindowDockStop->DockNode;
      if (pIVar5 == (ImGuiDockNode *)0x0) goto LAB_001292d9;
    }
    else {
      pIVar5 = DockNodeTreeFindVisibleNodeByPos(pIVar3->DockNodeAsHost,(ctx->IO).MousePos);
    }
    ctx->HoveredDockNode = pIVar5;
  }
LAB_001292d9:
  if (0 < (ctx->DockContext).Requests.Size) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pIVar4 = (ctx->DockContext).Requests.Data;
      if (*(int *)((long)&pIVar4->Type + lVar7) == 1) {
        DockContextProcessDock(ctx,(ImGuiDockRequest *)((long)&pIVar4->Type + lVar7));
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x40;
    } while (lVar8 < (ctx->DockContext).Requests.Size);
  }
  iVar2 = (ctx->DockContext).Requests.Capacity;
  if (iVar2 < 0) {
    uVar6 = iVar2 / 2 + iVar2;
    uVar9 = 0;
    if (0 < (int)uVar6) {
      uVar9 = (ulong)uVar6;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiDockRequest *)(*GImAllocatorAllocFunc)(uVar9 << 6,GImAllocatorUserData);
    pIVar4 = (ctx->DockContext).Requests.Data;
    if (pIVar4 != (ImGuiDockRequest *)0x0) {
      memcpy(__dest,pIVar4,(long)(ctx->DockContext).Requests.Size << 6);
      pIVar4 = (ctx->DockContext).Requests.Data;
      if ((pIVar4 != (ImGuiDockRequest *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (ctx->DockContext).Requests.Data = __dest;
    (ctx->DockContext).Requests.Capacity = (int)uVar9;
  }
  (ctx->DockContext).Requests.Size = 0;
  if (0 < (ctx->DockContext).Nodes.Data.Size) {
    lVar7 = 8;
    lVar8 = 0;
    do {
      pIVar5 = *(ImGuiDockNode **)((long)&((ctx->DockContext).Nodes.Data.Data)->key + lVar7);
      if (((pIVar5 != (ImGuiDockNode *)0x0) && (pIVar5->ParentNode == (ImGuiDockNode *)0x0)) &&
         ((pIVar5->LocalFlags & 0x400U) == 0)) {
        DockNodeUpdate(pIVar5);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 < (ctx->DockContext).Nodes.Data.Size);
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateDocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Store hovered dock node. We could in theory use DockNodeTreeFindVisibleNodeByPos() on the root host dock node, but using ->DockNode is a good shortcut.
    g.HoveredDockNode = NULL;
    if (ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow)
    {
        if (hovered_window->DockNodeAsHost)
            g.HoveredDockNode = DockNodeTreeFindVisibleNodeByPos(hovered_window->DockNodeAsHost, g.IO.MousePos);
        else if (hovered_window->RootWindowDockStop->DockNode)
            g.HoveredDockNode = hovered_window->RootWindowDockStop->DockNode;
    }

    // Process Docking requests
    for (int n = 0; n < dc->Requests.Size; n++)
        if (dc->Requests[n].Type == ImGuiDockRequestType_Dock)
            DockContextProcessDock(ctx, &dc->Requests[n]);
    dc->Requests.resize(0);

    // Create windows for each automatic docking nodes
    // We can have NULL pointers when we delete nodes, but because ID are recycled this should amortize nicely (and our node count will never be very high)
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsFloatingNode())
                DockNodeUpdate(node);
}